

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

int __thiscall QPDFJob::getExitCode(QPDFJob *this)

{
  element_type *peVar1;
  QPDFJob *this_local;
  
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar1->check_is_encrypted & 1U) == 0) {
    peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if ((peVar1->check_requires_password & 1U) == 0) {
      peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      if (((peVar1->warnings & 1U) != 0) &&
         (peVar1 = std::
                   __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this), (peVar1->warnings_exit_zero & 1U) == 0)) {
        return 3;
      }
      this_local._4_4_ = 0;
    }
    else {
      peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      if ((peVar1->encryption_status & 1) == 0) {
        QTC::TC("qpdf","QPDFJob check password not encrypted",0);
        this_local._4_4_ = 2;
      }
      else {
        peVar1 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        if ((peVar1->encryption_status & 2) == 0) {
          QTC::TC("qpdf","QPDFJob check password password correct",0);
          this_local._4_4_ = 3;
        }
        else {
          QTC::TC("qpdf","QPDFJob check password password incorrect",0);
          this_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if ((peVar1->encryption_status & 1) == 0) {
      QTC::TC("qpdf","QPDFJob check encrypted not encrypted",0);
      this_local._4_4_ = 2;
    }
    else {
      QTC::TC("qpdf","QPDFJob check encrypted encrypted",0);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int
QPDFJob::getExitCode() const
{
    if (m->check_is_encrypted) {
        if (m->encryption_status & qpdf_es_encrypted) {
            QTC::TC("qpdf", "QPDFJob check encrypted encrypted");
            return 0;
        } else {
            QTC::TC("qpdf", "QPDFJob check encrypted not encrypted");
            return EXIT_IS_NOT_ENCRYPTED;
        }
    } else if (m->check_requires_password) {
        if (m->encryption_status & qpdf_es_encrypted) {
            if (m->encryption_status & qpdf_es_password_incorrect) {
                QTC::TC("qpdf", "QPDFJob check password password incorrect");
                return 0;
            } else {
                QTC::TC("qpdf", "QPDFJob check password password correct");
                return EXIT_CORRECT_PASSWORD;
            }
        } else {
            QTC::TC("qpdf", "QPDFJob check password not encrypted");
            return EXIT_IS_NOT_ENCRYPTED;
        }
    }

    if (m->warnings && (!m->warnings_exit_zero)) {
        return EXIT_WARNING;
    }
    return 0;
}